

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O0

void libevent_log_cb(int severity,char *msg)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  undefined4 in_EDI;
  long in_FS_OFFSET;
  LogFlags unaff_retaddr;
  int in_stack_0000000c;
  Level level;
  ConstevalFormatString<1U> in_stack_00000048;
  size_t in_stack_00000050;
  undefined1 in_stack_00000060 [16];
  Level in_stack_00000140;
  char **in_stack_00000150;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),Trace);
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_EDI,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_EDI,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb0);
    source_file._M_str = msg;
    source_file._M_len = in_stack_00000050;
    LogPrintFormatInternal<char_const*>
              ((string_view)in_stack_00000060,source_file,in_stack_0000000c,unaff_retaddr,
               in_stack_00000140,in_stack_00000048,in_stack_00000150);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void libevent_log_cb(int severity, const char *msg)
{
    BCLog::Level level;
    switch (severity) {
    case EVENT_LOG_DEBUG:
        level = BCLog::Level::Debug;
        break;
    case EVENT_LOG_MSG:
        level = BCLog::Level::Info;
        break;
    case EVENT_LOG_WARN:
        level = BCLog::Level::Warning;
        break;
    default: // EVENT_LOG_ERR and others are mapped to error
        level = BCLog::Level::Error;
        break;
    }
    LogPrintLevel(BCLog::LIBEVENT, level, "%s\n", msg);
}